

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void wstran_dialer_connect(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  int iVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  _Var1 = nni_aio_start(aio,wstran_dialer_cancel,arg);
  if (_Var1) {
    iVar2 = nni_list_empty((nni_list *)((long)arg + 8));
    if (iVar2 == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/websocket.c"
                ,0x130,"nni_list_empty(&d->aios)");
    }
    *(undefined1 *)((long)arg + 0x220) = 1;
    nni_list_append((nni_list *)((long)arg + 8),aio);
    nng_stream_dialer_dial(*(nng_stream_dialer **)((long)arg + 0x210),(nng_aio *)((long)arg + 0x48))
    ;
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  return;
}

Assistant:

static void
wstran_dialer_connect(void *arg, nni_aio *aio)
{
	ws_dialer *d = arg;

	nni_aio_reset(aio);

	nni_mtx_lock(&d->mtx);
	if (!nni_aio_start(aio, wstran_dialer_cancel, d)) {
		nni_mtx_unlock(&d->mtx);
		return;
	}
	NNI_ASSERT(nni_list_empty(&d->aios));
	d->started = true;
	nni_list_append(&d->aios, aio);
	nng_stream_dialer_dial(d->dialer, &d->connaio);
	nni_mtx_unlock(&d->mtx);
}